

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::ServiceOptions::InternalSerializeWithCachedSizesToArray
          (ServiceOptions *this,uint8 *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint32 uVar2;
  uint uVar3;
  uint8 *puVar4;
  uint8 *in_RSI;
  ServiceOptions *in_RDI;
  uint n;
  uint i;
  uint32 cached_has_bits;
  uint8 **in_stack_ffffffffffffff08;
  uint local_e0;
  uint8 *local_d0;
  EpsCopyOutputStream *in_stack_ffffffffffffff48;
  EpsCopyOutputStream *in_stack_ffffffffffffff50;
  UninterpretedOption *in_stack_ffffffffffffff58;
  EpsCopyOutputStream *stream_00;
  int in_stack_ffffffffffffff60;
  int start_field_number;
  ExtensionSet *this_00;
  
  this_00 = (ExtensionSet *)&in_RDI->_has_bits_;
  start_field_number = 0;
  local_d0 = in_RSI;
  if ((((HasBits<1UL> *)this_00)->has_bits_[0] & 1) != 0) {
    io::EpsCopyOutputStream::EnsureSpace((EpsCopyOutputStream *)in_RDI,in_stack_ffffffffffffff08);
    bVar1 = _internal_deprecated(in_RDI);
    uVar2 = internal::WireFormatLite::MakeTag(0x21,WIRETYPE_VARINT);
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray(uVar2,in_RSI);
    local_d0 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,puVar4);
  }
  local_e0 = 0;
  uVar3 = _internal_uninterpreted_option_size((ServiceOptions *)0x520ee1);
  for (; local_e0 < uVar3; local_e0 = local_e0 + 1) {
    io::EpsCopyOutputStream::EnsureSpace((EpsCopyOutputStream *)in_RDI,in_stack_ffffffffffffff08);
    _internal_uninterpreted_option(in_RDI,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    uVar2 = internal::WireFormatLite::MakeTag(999,WIRETYPE_LENGTH_DELIMITED);
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray(uVar2,local_d0);
    uVar2 = UninterpretedOption::GetCachedSize((UninterpretedOption *)0x520fac);
    io::CodedOutputStream::WriteVarint32ToArray(uVar2,puVar4);
    local_d0 = UninterpretedOption::InternalSerializeWithCachedSizesToArray
                         (in_stack_ffffffffffffff58,(uint8 *)in_stack_ffffffffffffff50,
                          in_stack_ffffffffffffff48);
  }
  local_d0 = internal::ExtensionSet::InternalSerializeWithCachedSizesToArray
                       (this_00,start_field_number,in_stack_ffffffffffffff60,
                        (uint8 *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  if (((uint)(in_RDI->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    stream_00 = (EpsCopyOutputStream *)&in_RDI->_internal_metadata_;
    if (((uint)(((InternalMetadataWithArena *)stream_00)->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)stream_00);
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
    }
    local_d0 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                         ((UnknownFieldSet *)this_00,
                          (uint8 *)CONCAT44(start_field_number,in_stack_ffffffffffffff60),stream_00)
    ;
  }
  return local_d0;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* ServiceOptions::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.ServiceOptions)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional bool deprecated = 33 [default = false];
  if (cached_has_bits & 0x00000001u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(33, this->_internal_deprecated(), target);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_uninterpreted_option_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(999, this->_internal_uninterpreted_option(i), target, stream);
  }

  // Extension range [1000, 536870912)
  target = _extensions_.InternalSerializeWithCachedSizesToArray(
      1000, 536870912, target, stream);

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.ServiceOptions)
  return target;
}